

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmIllegal<(moira::Instr)137,(moira::Mode)7,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char *pcVar3;
  Int i;
  long lVar4;
  char cVar5;
  
  SVar1 = str->style->syntax;
  if (1 < SVar1 - GNU) {
    cVar5 = 'd';
    if (SVar1 == MUSASHI) {
      lVar4 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar5;
        cVar5 = "dc.w "[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      StrWriter::operator<<(str,(UInt16)op);
      cVar5 = ';';
      lVar4 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar5;
        cVar5 = "dc.w $%04x; ILLEGAL"[lVar4 + 10];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
    }
    else {
      lVar4 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar5;
        cVar5 = "dc.w "[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,(UInt16)op);
      cVar5 = ';';
      lVar4 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar5;
        cVar5 = "dc.w $%04x; ILLEGAL"[lVar4 + 10];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
    }
    return;
  }
  cVar5 = '.';
  lVar4 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar5;
    cVar5 = ".short "[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  i.raw._2_2_ = 0;
  i.raw._0_2_ = op;
  StrWriter::operator<<(str,i);
  return;
}

Assistant:

void
Moira::dasmIllegal(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        case Syntax::MUSASHI:

            str << "dc.w " << UInt16{op} << "; ILLEGAL";
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; ILLEGAL";
            break;
    }
}